

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

int SUNMatMatvec_Sparse(SUNMatrix A,N_Vector x,N_Vector y)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  bool bVar6;
  SUNMatrix_ID SVar7;
  sunindextype sVar8;
  realtype *prVar9;
  realtype *prVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  sunindextype *Aj;
  realtype *Ax;
  realtype rVar16;
  
  iVar14 = -0x2bd;
  if ((x->ops->nvgetarraypointer != (_func_realtype_ptr_N_Vector *)0x0) &&
     (y->ops->nvgetarraypointer != (_func_realtype_ptr_N_Vector *)0x0)) {
    SVar7 = SUNMatGetID(A);
    iVar14 = -0x2bd;
    iVar15 = -0x2bd;
    if (SVar7 == SUNMATRIX_SPARSE) {
      iVar15 = *(int *)((long)A->content + 4);
    }
    sVar8 = N_VGetLength(x);
    if (iVar15 == sVar8) {
      SVar7 = SUNMatGetID(A);
      iVar14 = -0x2bd;
      iVar15 = -0x2bd;
      if (SVar7 == SUNMATRIX_SPARSE) {
        iVar15 = *A->content;
      }
      sVar8 = N_VGetLength(y);
      if (iVar15 == sVar8) {
        pvVar1 = A->content;
        lVar2 = *(long *)((long)pvVar1 + 0x28);
        lVar3 = *(long *)((long)pvVar1 + 0x10);
        lVar4 = *(long *)((long)pvVar1 + 0x20);
        bVar6 = lVar3 == 0 || (lVar4 == 0 || lVar2 == 0);
        if (*(int *)((long)pvVar1 + 0x18) == 0) {
          if (bVar6) {
            return -0x2be;
          }
          prVar9 = N_VGetArrayPointer(x);
          prVar10 = N_VGetArrayPointer(y);
          if (prVar9 == prVar10 || (prVar10 == (realtype *)0x0 || prVar9 == (realtype *)0x0)) {
            return -0x2be;
          }
          piVar5 = (int *)A->content;
          lVar11 = (long)*piVar5;
          if (0 < lVar11) {
            memset(prVar10,0,lVar11 << 3);
          }
          lVar11 = (long)piVar5[1];
          if (0 < lVar11) {
            lVar13 = 0;
            do {
              iVar14 = *(int *)(lVar2 + lVar13 * 4);
              lVar12 = (long)iVar14;
              iVar15 = *(int *)(lVar2 + 4 + lVar13 * 4);
              if (iVar14 < iVar15) {
                do {
                  iVar14 = *(int *)(lVar4 + lVar12 * 4);
                  prVar10[iVar14] =
                       *(double *)(lVar3 + lVar12 * 8) * prVar9[lVar13] + prVar10[iVar14];
                  lVar12 = lVar12 + 1;
                } while (iVar15 != lVar12);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != lVar11);
            return 0;
          }
        }
        else {
          if (bVar6) {
            return -0x2be;
          }
          prVar9 = N_VGetArrayPointer(x);
          prVar10 = N_VGetArrayPointer(y);
          if (prVar9 == prVar10 || (prVar10 == (realtype *)0x0 || prVar9 == (realtype *)0x0)) {
            return -0x2be;
          }
          lVar11 = (long)*A->content;
          if (0 < lVar11) {
            lVar13 = 0;
            memset(prVar10,0,lVar11 * 8);
            do {
              iVar14 = *(int *)(lVar2 + lVar13 * 4);
              lVar12 = (long)iVar14;
              iVar15 = *(int *)(lVar2 + 4 + lVar13 * 4);
              if (iVar14 < iVar15) {
                rVar16 = prVar10[lVar13];
                do {
                  rVar16 = rVar16 + *(double *)(lVar3 + lVar12 * 8) *
                                    prVar9[*(int *)(lVar4 + lVar12 * 4)];
                  prVar10[lVar13] = rVar16;
                  lVar12 = lVar12 + 1;
                } while (iVar15 != lVar12);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != lVar11);
            return 0;
          }
        }
        iVar14 = 0;
      }
    }
  }
  return iVar14;
}

Assistant:

static booleantype SMCompatible2_Sparse(SUNMatrix A, N_Vector x, N_Vector y)
{
  /* vectors must implement N_VGetArrayPointer */
  if ( (x->ops->nvgetarraypointer == NULL) ||
       (y->ops->nvgetarraypointer == NULL) )
    return SUNFALSE;

  /* Verify that the dimensions of A, x, and y agree */
  if ( (SUNSparseMatrix_Columns(A) != N_VGetLength(x)) ||
       (SUNSparseMatrix_Rows(A) != N_VGetLength(y)) )
    return SUNFALSE;

  return SUNTRUE;
}